

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O2

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<int>::Visit
          (PrecomputeVisitor<int> *this,shared_ptr<const_calc4::ConditionalOperator> *op)

{
  bool bVar1;
  PrecomputeVisitor<int> *pPVar2;
  shared_ptr<const_calc4::Operator> sVar3;
  int conditionValue;
  shared_ptr<const_calc4::Operator> condition;
  shared_ptr<const_calc4::Operator> ifFalse;
  shared_ptr<const_calc4::Operator> ifTrue;
  undefined1 local_5c [4];
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  PrecomputeVisitor<int> local_38;
  
  Precompute((PrecomputeVisitor<int> *)local_58,(shared_ptr<const_calc4::Operator> *)this);
  Precompute(&local_38,(shared_ptr<const_calc4::Operator> *)this);
  sVar3 = Precompute((PrecomputeVisitor<int> *)(local_58 + 0x10),
                     (shared_ptr<const_calc4::Operator> *)this);
  bVar1 = TryGetPrecomputedValue
                    ((PrecomputeVisitor<int> *)local_58,
                     (shared_ptr<const_calc4::Operator> *)local_5c,
                     (int *)sVar3.
                            super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi._M_pi);
  if (bVar1) {
    pPVar2 = &local_38;
    if (local_5c == (undefined1  [4])0x0) {
      pPVar2 = (PrecomputeVisitor<int> *)(local_58 + 0x10);
    }
    std::__shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2> *)pPVar2);
  }
  else {
    ConditionalOperator::Create
              (&local_38.value,(shared_ptr<const_calc4::Operator> *)local_58,
               (shared_ptr<const_calc4::Operator> *)&local_38);
    std::__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2> *)&this->value,
               (__shared_ptr<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2> *)
               &local_38.value);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.value.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.context);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const ConditionalOperator>& op) override
    {
        std::shared_ptr<const Operator> condition = Precompute(op->GetCondition());
        std::shared_ptr<const Operator> ifTrue = Precompute(op->GetIfTrue());
        std::shared_ptr<const Operator> ifFalse = Precompute(op->GetIfFalse());

        TNumber conditionValue;
        if (TryGetPrecomputedValue(condition, &conditionValue))
        {
            value = conditionValue != 0 ? ifTrue : ifFalse;
        }
        else
        {
            value = ConditionalOperator::Create(condition, ifTrue, ifFalse);
        }
    }